

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O3

bool Assimp::TokenMatch<char_const>(char **in,char *token,uint len)

{
  byte bVar1;
  char *__s2;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong __n;
  
  __s2 = *in;
  __n = (ulong)len;
  iVar4 = strncmp(token,__s2,__n);
  if (iVar4 == 0) {
    bVar1 = __s2[__n];
    bVar3 = false;
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar2 = (ulong)(len + 1);
      if (bVar1 == 0) {
        uVar2 = __n;
      }
      *in = __s2 + uVar2;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

AI_FORCE_INLINE
bool TokenMatch(char_t*& in, const char* token, unsigned int len)
{
    if (!::strncmp(token,in,len) && IsSpaceOrNewLine(in[len])) {
        if (in[len] != '\0') {
            in += len+1;
        } else {
            // If EOF after the token make sure we don't go past end of buffer
            in += len;
        }
        return true;
    }

    return false;
}